

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarLayout(ImGuiTabBar *tab_bar)

{
  ImGuiTabItem *pIVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  ImGuiID IVar7;
  ImGuiShrinkWidthItem *pIVar8;
  char *__src;
  ImVec2 IVar9;
  ImGuiID IVar10;
  ImGuiID IVar11;
  undefined8 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  ImGuiContext *pIVar17;
  undefined4 uVar18;
  bool bVar19;
  bool bVar20;
  int section_n;
  long lVar21;
  ImGuiTabItem *pIVar22;
  ImGuiShrinkWidthItem *__dest;
  char *__dest_00;
  int iVar23;
  int iVar24;
  ulong uVar25;
  uint uVar26;
  ImGuiID IVar27;
  int iVar28;
  size_t __nmemb;
  ulong uVar29;
  ulong uVar30;
  ImGuiTabItem *pIVar31;
  long lVar32;
  uint uVar33;
  ImGuiID *pIVar34;
  long lVar35;
  ImGuiContext *pIVar36;
  ImGuiWindow *pIVar37;
  ImGuiTabItem *pIVar38;
  size_t size;
  int iVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar46;
  float fVar47;
  ImGuiTabBarSection sections [3];
  int shrink_buffer_indexes [3];
  ImVec4 arrow_col;
  undefined8 uStack_110;
  float local_108 [3];
  int local_fc;
  float local_f8;
  float local_f4;
  int local_f0;
  float local_ec;
  float local_e8;
  ImGuiContext *local_d8;
  ImVec2 local_d0;
  undefined1 local_c8 [16];
  ImGuiWindow *local_b0;
  int local_a4 [2];
  float local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  undefined4 uStack_80;
  undefined4 uStack_7c;
  ImVec4 local_78;
  undefined8 local_68;
  ImVec2 local_60;
  ImVec4 local_58;
  undefined1 local_48 [16];
  
  pIVar36 = GImGui;
  tab_bar->WantLayout = false;
  lVar21 = 0;
  do {
    *(undefined4 *)((long)local_108 + lVar21 + 8) = 0;
    *(undefined8 *)((long)local_108 + lVar21) = 0;
    lVar21 = lVar21 + 0xc;
  } while (lVar21 != 0x24);
  uVar33 = (tab_bar->Tabs).Size;
  if ((int)uVar33 < 1) {
    bVar19 = false;
    uVar26 = 0;
  }
  else {
    lVar21 = 0;
    uVar30 = 0;
    uVar26 = 0;
    bVar19 = false;
    do {
      pIVar38 = (tab_bar->Tabs).Data;
      pIVar34 = (ImGuiID *)((long)&pIVar38->ID + lVar21);
      if ((*(int *)((long)&pIVar38->LastFrameVisible + lVar21) < tab_bar->PrevFrameVisible) ||
         ((&pIVar38->WantClose)[lVar21] == true)) {
        if (tab_bar->VisibleTabId == *pIVar34) {
          tab_bar->VisibleTabId = 0;
        }
        if (tab_bar->SelectedTabId == *pIVar34) {
          tab_bar->SelectedTabId = 0;
        }
        if (tab_bar->NextSelectedTabId == *pIVar34) {
          tab_bar->NextSelectedTabId = 0;
        }
      }
      else {
        if (uVar30 != uVar26) {
          IVar27 = *pIVar34;
          IVar7 = pIVar34[1];
          IVar10 = pIVar34[2];
          IVar11 = pIVar34[3];
          fVar40 = (float)pIVar34[4];
          fVar42 = (float)pIVar34[5];
          fVar41 = (float)pIVar34[6];
          fVar43 = (float)pIVar34[7];
          uVar12 = *(undefined8 *)((long)pIVar34 + 0x21);
          puVar2 = (undefined8 *)((long)&pIVar38[(int)uVar26].ContentWidth + 1);
          *puVar2 = *(undefined8 *)((long)pIVar34 + 0x19);
          puVar2[1] = uVar12;
          pfVar3 = &pIVar38[(int)uVar26].Offset;
          *pfVar3 = fVar40;
          pfVar3[1] = fVar42;
          pfVar3[2] = fVar41;
          pfVar3[3] = fVar43;
          pIVar38 = pIVar38 + (int)uVar26;
          pIVar38->ID = IVar27;
          pIVar38->Flags = IVar7;
          pIVar38->LastFrameVisible = IVar10;
          pIVar38->LastFrameSelected = IVar11;
        }
        pIVar38 = (tab_bar->Tabs).Data;
        pIVar38[(int)uVar26].IndexDuringLayout = (ImS16)uVar26;
        uVar33 = pIVar38[(int)uVar26].Flags;
        lVar35 = 0;
        if ((uVar33 & 0x40) == 0) {
          lVar35 = (ulong)((char)uVar33 < '\0') + 1;
        }
        if (0 < (int)uVar26) {
          uVar6 = (tab_bar->Tabs).Data[(ulong)uVar26 - 1].Flags;
          bVar20 = bVar19;
          if ((uVar6 & 0x40) == 0) {
            bVar20 = true;
          }
          if ((uVar33 & 0x40) == 0) {
            bVar20 = bVar19;
          }
          bVar19 = bVar20;
          if ((uVar6 & 0xc0) == 0x80) {
            bVar19 = true;
          }
          if ((uVar33 & 0xc0) == 0x80) {
            bVar19 = bVar20;
          }
        }
        local_108[lVar35 * 3] = (float)((int)local_108[lVar35 * 3] + 1);
        uVar26 = uVar26 + 1;
      }
      uVar30 = uVar30 + 1;
      uVar33 = (tab_bar->Tabs).Size;
      lVar21 = lVar21 + 0x2c;
    } while ((long)uVar30 < (long)(int)uVar33);
  }
  if (uVar33 != uVar26) {
    iVar24 = (tab_bar->Tabs).Capacity;
    if (iVar24 < (int)uVar26) {
      if (iVar24 == 0) {
        uVar33 = 8;
      }
      else {
        uVar33 = iVar24 / 2 + iVar24;
      }
      if ((int)uVar33 <= (int)uVar26) {
        uVar33 = uVar26;
      }
      if (iVar24 < (int)uVar33) {
        uStack_110 = 0x227650;
        pIVar22 = (ImGuiTabItem *)MemAlloc((long)(int)uVar33 * 0x2c);
        pIVar38 = (tab_bar->Tabs).Data;
        if (pIVar38 != (ImGuiTabItem *)0x0) {
          uStack_110 = 0x22766b;
          memcpy(pIVar22,pIVar38,(long)(tab_bar->Tabs).Size * 0x2c);
          uStack_110 = 0x227674;
          MemFree((tab_bar->Tabs).Data);
        }
        (tab_bar->Tabs).Data = pIVar22;
        (tab_bar->Tabs).Capacity = uVar33;
      }
    }
    (tab_bar->Tabs).Size = uVar26;
  }
  if ((bVar19) && (__nmemb = (size_t)(tab_bar->Tabs).Size, 1 < __nmemb)) {
    uStack_110 = 0x2276a2;
    qsort((tab_bar->Tabs).Data,__nmemb,0x2c,TabItemComparerBySection);
  }
  local_f4 = 0.0;
  local_108[2] = 0.0;
  if ((0 < (int)local_108[0]) &&
     (local_f0 + local_fc != 0 && SCARRY4(local_f0,local_fc) == local_f0 + local_fc < 0)) {
    local_108[2] = (pIVar36->Style).ItemInnerSpacing.x;
  }
  if ((0 < local_fc) && (0 < local_f0)) {
    local_f4 = (pIVar36->Style).ItemInnerSpacing.x;
  }
  IVar27 = tab_bar->NextSelectedTabId;
  if (IVar27 == 0) {
    IVar27 = 0;
  }
  else {
    tab_bar->SelectedTabId = IVar27;
    tab_bar->NextSelectedTabId = 0;
  }
  if (tab_bar->ReorderRequestTabId != 0) {
    uStack_110 = 0x227709;
    bVar19 = TabBarProcessReorder(tab_bar);
    if ((bVar19) && (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)) {
      IVar27 = tab_bar->ReorderRequestTabId;
    }
    tab_bar->ReorderRequestTabId = 0;
  }
  pIVar17 = GImGui;
  local_d8 = pIVar36;
  if ((tab_bar->Flags & 4) != 0) {
    local_c8._0_4_ = IVar27;
    pIVar37 = GImGui->CurrentWindow;
    fVar40 = (GImGui->Style).FramePadding.y;
    fVar42 = GImGui->FontSize;
    local_d0 = (pIVar37->DC).CursorPos;
    fVar41 = (tab_bar->BarRect).Min.y;
    (pIVar37->DC).CursorPos.x = (tab_bar->BarRect).Min.x - fVar40;
    (pIVar37->DC).CursorPos.y = fVar41;
    (tab_bar->BarRect).Min.x = fVar42 + fVar40 + (tab_bar->BarRect).Min.x;
    local_58.x = (pIVar17->Style).Colors[0].x;
    local_58.y = (pIVar17->Style).Colors[0].y;
    uVar13 = (pIVar17->Style).Colors[0].z;
    uVar14 = (pIVar17->Style).Colors[0].w;
    local_58.w = (float)uVar14 * 0.5;
    local_58.z = (float)uVar13;
    pIVar34 = (ImGuiID *)0x0;
    uStack_110 = 0x2277bb;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    uStack_110 = 0x2277d3;
    PushStyleColor(0x15,&local_78);
    uStack_110 = 0x2277e6;
    bVar19 = BeginCombo("##v",(char *)0x0,0x50);
    uStack_110 = 0x2277f2;
    PopStyleColor(2);
    if (bVar19) {
      local_b0 = pIVar37;
      if ((tab_bar->Tabs).Size < 1) {
        pIVar34 = (ImGuiID *)0x0;
      }
      else {
        lVar21 = 0;
        lVar35 = 0;
        pIVar34 = (ImGuiID *)0x0;
        do {
          pIVar38 = (tab_bar->Tabs).Data;
          if ((*(byte *)((long)&pIVar38->Flags + lVar21 + 2) & 0x20) == 0) {
            local_78.x = 0.0;
            local_78.y = 0.0;
            uStack_110 = 0x227852;
            bVar19 = Selectable((tab_bar->TabsNames).Buf.Data +
                                *(int *)((long)&pIVar38->NameOffset + lVar21),
                                tab_bar->SelectedTabId == *(ImGuiID *)((long)&pIVar38->ID + lVar21),
                                0,(ImVec2 *)&local_78);
            if (bVar19) {
              pIVar34 = (ImGuiID *)((long)&pIVar38->ID + lVar21);
            }
          }
          lVar35 = lVar35 + 1;
          lVar21 = lVar21 + 0x2c;
        } while (lVar35 < (tab_bar->Tabs).Size);
      }
      uStack_110 = 0x227871;
      EndPopup();
      pIVar36 = local_d8;
      pIVar37 = local_b0;
    }
    (pIVar37->DC).CursorPos = local_d0;
    IVar27 = local_c8._0_4_;
    if (pIVar34 != (ImGuiID *)0x0) {
      IVar27 = *pIVar34;
      tab_bar->SelectedTabId = IVar27;
    }
  }
  local_a4[0] = 0;
  uVar30 = (ulong)(uint)(local_f0 + (int)local_108[0]);
  local_a4[1] = local_f0 + (int)local_108[0];
  local_9c = local_108[0];
  iVar24 = (tab_bar->Tabs).Size;
  iVar23 = (pIVar36->ShrinkWidthBuffer).Capacity;
  if (iVar23 < iVar24) {
    if (iVar23 == 0) {
      iVar39 = 8;
    }
    else {
      iVar39 = iVar23 / 2 + iVar23;
    }
    if (iVar39 <= iVar24) {
      iVar39 = iVar24;
    }
    if (iVar23 < iVar39) {
      uStack_110 = 0x2278f8;
      __dest = (ImGuiShrinkWidthItem *)MemAlloc((long)iVar39 * 0xc);
      pIVar8 = (pIVar36->ShrinkWidthBuffer).Data;
      if (pIVar8 != (ImGuiShrinkWidthItem *)0x0) {
        uStack_110 = 0x22791e;
        memcpy(__dest,pIVar8,(long)(pIVar36->ShrinkWidthBuffer).Size * 0xc);
        uStack_110 = 0x22792a;
        MemFree((pIVar36->ShrinkWidthBuffer).Data);
      }
      (pIVar36->ShrinkWidthBuffer).Data = __dest;
      (pIVar36->ShrinkWidthBuffer).Capacity = iVar39;
    }
  }
  (pIVar36->ShrinkWidthBuffer).Size = iVar24;
  bVar19 = false;
  if ((tab_bar->Tabs).Size < 1) {
    pIVar38 = (ImGuiTabItem *)CONCAT71((int7)(uVar30 >> 8),1);
    local_d0 = (ImVec2)0x0;
  }
  else {
    lVar21 = 0;
    lVar35 = 0;
    local_d0 = (ImVec2)0x0;
    bVar20 = false;
    iVar24 = -1;
    do {
      pIVar38 = (tab_bar->Tabs).Data;
      pIVar34 = (ImGuiID *)((long)&pIVar38->ID + lVar21);
      if (((local_d0 == (ImVec2)0x0) ||
          ((int)*(ImGuiID *)((long)local_d0 + 0xc) <
           *(int *)((long)&pIVar38->LastFrameSelected + lVar21))) &&
         ((*(byte *)((long)&pIVar38->Flags + lVar21 + 2) & 0x20) == 0)) {
        local_d0 = (ImVec2)pIVar34;
      }
      IVar7 = *pIVar34;
      if (IVar7 == tab_bar->SelectedTabId) {
        bVar20 = true;
      }
      if ((IVar27 == 0) && (IVar27 = IVar7, local_d8->NavJustMovedToId != IVar7)) {
        IVar27 = 0;
      }
      fVar40 = *(float *)((long)&pIVar38->RequestedWidth + lVar21);
      if (fVar40 < 0.0) {
        local_c8._0_4_ = IVar27;
        uStack_110 = 0x2279f2;
        IVar9 = TabItemCalcSize((tab_bar->TabsNames).Buf.Data +
                                *(int *)((long)&pIVar38->NameOffset + lVar21),
                                (*(uint *)((long)&pIVar38->Flags + lVar21) & 0x100001) != 0x100000);
        fVar40 = IVar9.x;
        IVar27 = local_c8._0_4_;
      }
      *(float *)((long)&pIVar38->ContentWidth + lVar21) = fVar40;
      uVar33 = *(uint *)((long)&pIVar38->Flags + lVar21);
      uVar30 = (ulong)(((char)uVar33 < '\0') + 1);
      if ((uVar33 & 0x40) != 0) {
        uVar30 = 0;
      }
      fVar42 = 0.0;
      if ((int)uVar30 == iVar24) {
        fVar42 = (local_d8->Style).ItemInnerSpacing.x;
      }
      local_108[uVar30 * 3 + 1] = fVar40 + fVar42 + local_108[uVar30 * 3 + 1];
      iVar24 = local_a4[uVar30];
      local_a4[uVar30] = iVar24 + 1;
      pIVar8 = (local_d8->ShrinkWidthBuffer).Data;
      pIVar8[iVar24].Index = (int)lVar35;
      fVar40 = *(float *)((long)&pIVar38->ContentWidth + lVar21);
      pIVar8[iVar24].InitialWidth = fVar40;
      pIVar8[iVar24].Width = fVar40;
      fVar40 = *(float *)((long)&pIVar38->ContentWidth + lVar21);
      if (fVar40 <= 1.0) {
        fVar40 = 1.0;
      }
      *(float *)((long)&pIVar38->Width + lVar21) = fVar40;
      lVar35 = lVar35 + 1;
      iVar23 = (tab_bar->Tabs).Size;
      lVar21 = lVar21 + 0x2c;
      iVar24 = (int)uVar30;
    } while (lVar35 < iVar23);
    bVar19 = 1 < iVar23;
    pIVar38 = (ImGuiTabItem *)CONCAT71((int7)(int3)((uint)iVar23 >> 8),!bVar20);
    pIVar36 = local_d8;
  }
  tab_bar->WidthAllTabsIdeal = 0.0;
  fVar40 = 0.0;
  lVar21 = 8;
  do {
    fVar40 = fVar40 + *(float *)((long)&uStack_110 + lVar21 + 4) +
                      *(float *)((long)local_108 + lVar21);
    lVar21 = lVar21 + 0xc;
  } while (lVar21 != 0x2c);
  tab_bar->WidthAllTabsIdeal = fVar40;
  pIVar17 = GImGui;
  local_b0 = (ImGuiWindow *)CONCAT71(local_b0._1_7_,(char)pIVar38);
  if (((bool)(bVar19 & (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x < fVar40)) &&
     ((tab_bar->Flags & 0x90U) == 0x80)) {
    pIVar37 = GImGui->CurrentWindow;
    fVar42 = GImGui->FontSize + -2.0;
    local_98 = ZEXT416((uint)fVar42);
    fVar40 = (GImGui->Style).FramePadding.y;
    _local_88 = ZEXT416((uint)(fVar40 + fVar40 + GImGui->FontSize));
    local_c8 = ZEXT416((uint)(fVar42 + fVar42));
    local_60 = (pIVar37->DC).CursorPos;
    local_58.x = (GImGui->Style).Colors[0].x;
    local_58.y = (GImGui->Style).Colors[0].y;
    uVar15 = (GImGui->Style).Colors[0].z;
    uVar16 = (GImGui->Style).Colors[0].w;
    local_58.w = (float)uVar16 * 0.5;
    local_58.z = (float)uVar15;
    uStack_110 = 0x227bbb;
    PushStyleColor(0,&local_58);
    local_78.x = 0.0;
    local_78.y = 0.0;
    local_78.z = 0.0;
    local_78.w = 0.0;
    uStack_110 = 0x227bd3;
    PushStyleColor(0x15,&local_78);
    local_68._0_4_ = (pIVar17->IO).KeyRepeatDelay;
    local_68._4_4_ = (pIVar17->IO).KeyRepeatRate;
    (pIVar17->IO).KeyRepeatDelay = 0.25;
    (pIVar17->IO).KeyRepeatRate = 0.2;
    fVar40 = (tab_bar->BarRect).Min.x;
    fVar42 = (tab_bar->BarRect).Max.x - (float)local_c8._0_4_;
    uVar33 = -(uint)(fVar42 <= fVar40);
    fVar42 = (float)(uVar33 & (uint)fVar40 | ~uVar33 & (uint)fVar42);
    local_48 = ZEXT416((uint)fVar42);
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar37->DC).CursorPos.x = fVar42;
    (pIVar37->DC).CursorPos.y = fVar40;
    uVar18 = local_88._0_4_;
    uStack_7c = local_88._4_4_;
    local_88._4_4_ = local_88._0_4_;
    local_88._0_4_ = local_98._0_4_;
    uStack_80 = local_98._4_4_;
    uStack_110 = 0x227c59;
    IVar9.y = (float)uVar18;
    IVar9.x = (float)local_98._0_4_;
    bVar19 = ArrowButtonEx("##<",0,IVar9,0x410);
    fVar40 = (tab_bar->BarRect).Min.y;
    (pIVar37->DC).CursorPos.x = (float)local_48._0_4_ + (float)local_98._0_4_;
    local_98._0_8_ = pIVar37;
    (pIVar37->DC).CursorPos.y = fVar40;
    uStack_110 = 0x227caa;
    bVar20 = ArrowButtonEx("##>",1,(ImVec2)local_88,0x410);
    iVar24 = -(uint)bVar19;
    if (bVar20) {
      iVar24 = 1;
    }
    uStack_110 = 0x227cba;
    PopStyleColor(2);
    (pIVar17->IO).KeyRepeatDelay = (float)(undefined4)local_68;
    (pIVar17->IO).KeyRepeatRate = (float)local_68._4_4_;
    if (iVar24 == 0) {
LAB_00227d8d:
      pIVar38 = (ImGuiTabItem *)0x0;
    }
    else {
      IVar7 = tab_bar->SelectedTabId;
      if (IVar7 == 0) {
LAB_00227d38:
        pIVar38 = (ImGuiTabItem *)0x0;
      }
      else {
        uVar30 = (ulong)(tab_bar->Tabs).Size;
        bVar19 = 0 < (long)uVar30;
        if (0 < (long)uVar30) {
          pIVar38 = (tab_bar->Tabs).Data;
          bVar19 = true;
          if (pIVar38->ID != IVar7) {
            pIVar31 = pIVar38 + (uVar30 - 1);
            pIVar22 = pIVar38;
            uVar25 = 0;
            do {
              uVar29 = uVar30;
              pIVar38 = pIVar31;
              if (uVar30 - 1 == uVar25) break;
              pIVar38 = pIVar22 + 1;
              uVar29 = uVar25 + 1;
              pIVar1 = pIVar22 + 1;
              pIVar22 = pIVar38;
              uVar25 = uVar29;
            } while (pIVar1->ID != IVar7);
            bVar19 = uVar29 < uVar30;
          }
        }
        if (!bVar19) goto LAB_00227d38;
      }
      if (pIVar38 == (ImGuiTabItem *)0x0) goto LAB_00227d8d;
      pIVar22 = (tab_bar->Tabs).Data;
      iVar23 = (int)((ulong)((long)pIVar38 - (long)pIVar22) >> 2) * -0x45d1745d;
      iVar39 = iVar24 + iVar23;
      do {
        if ((iVar39 < 0) || (iVar28 = iVar39, (tab_bar->Tabs).Size <= iVar39)) {
          iVar28 = iVar23;
        }
        pIVar38 = pIVar22 + iVar28;
        if ((pIVar22[iVar28].Flags & 0x200000) != 0) {
          iVar23 = iVar23 + iVar24;
          iVar39 = iVar39 + iVar24;
          if ((-1 < iVar39) && (iVar39 < (tab_bar->Tabs).Size)) {
            pIVar38 = (ImGuiTabItem *)0x0;
          }
        }
      } while (pIVar38 == (ImGuiTabItem *)0x0);
    }
    *(ImVec2 *)(local_98._0_8_ + 0xe0) = local_60;
    (tab_bar->BarRect).Max.x = (tab_bar->BarRect).Max.x - ((float)local_c8._0_4_ + 1.0);
    pIVar36 = local_d8;
    if ((pIVar38 != (ImGuiTabItem *)0x0) && (IVar27 = pIVar38->ID, (pIVar38->Flags & 0x200000) == 0)
       ) {
      tab_bar->SelectedTabId = IVar27;
    }
  }
  fVar40 = local_108[1] + local_108[2] + local_ec + local_e8;
  fVar42 = (tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x;
  local_c8._0_4_ = IVar27;
  if (fVar40 < fVar42) {
    fVar41 = (local_f4 + local_f8) -
             ((fVar42 - (local_108[1] + local_108[2])) - (local_ec + local_e8));
    fVar41 = (float)(-(uint)(0.0 <= fVar41) & (uint)fVar41);
  }
  else {
    fVar41 = fVar40 - fVar42;
  }
  if ((1.0 <= fVar41) && ((fVar42 <= fVar40 || ((tab_bar->Flags & 0x40U) != 0)))) {
    iVar24 = local_f0 + (int)local_108[0];
    iVar23 = local_fc;
    if (fVar42 <= fVar40) {
      iVar24 = 0;
      iVar23 = local_f0 + (int)local_108[0];
    }
    lVar21 = (long)iVar24;
    uStack_110 = 0x227e86;
    ShrinkWidths((pIVar36->ShrinkWidthBuffer).Data + lVar21,iVar23,fVar41);
    if (0 < iVar23) {
      lVar35 = lVar21 * 0xc + 4;
      do {
        pIVar8 = (pIVar36->ShrinkWidthBuffer).Data;
        iVar39 = (int)*(float *)((long)&pIVar8->Index + lVar35);
        if (-1 < iVar39) {
          pIVar38 = (tab_bar->Tabs).Data;
          iVar28 = *(int *)((long)pIVar8 + lVar35 + -4);
          fVar40 = (float)iVar39;
          lVar32 = (ulong)((char)pIVar38[iVar28].Flags < '\0') + 1;
          if ((pIVar38[iVar28].Flags & 0x40U) != 0) {
            lVar32 = 0;
          }
          fVar42 = 1.0;
          if (1.0 <= fVar40) {
            fVar42 = fVar40;
          }
          local_108[lVar32 * 3 + 1] = local_108[lVar32 * 3 + 1] - (pIVar38[iVar28].Width - fVar42);
          pIVar38[iVar28].Width = fVar42;
        }
        lVar21 = lVar21 + 1;
        lVar35 = lVar35 + 0xc;
      } while (lVar21 < iVar24 + iVar23);
    }
  }
  tab_bar->WidthAllTabs = 0.0;
  lVar21 = 0;
  fVar40 = 0.0;
  iVar24 = 0;
  do {
    fVar42 = fVar40;
    if ((lVar21 == 2) &&
       (fVar42 = ((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_108[7],
       fVar42 = (float)(~-(uint)(fVar42 <= 0.0) & (uint)fVar42), fVar40 <= fVar42)) {
      fVar42 = fVar40;
    }
    fVar41 = local_108[lVar21 * 3];
    if (0 < (int)fVar41) {
      fVar41 = local_108[lVar21 * 3];
      lVar35 = (long)iVar24 * 0x2c + 0x14;
      lVar32 = 0;
      do {
        pIVar38 = (tab_bar->Tabs).Data;
        *(float *)((long)pIVar38 + lVar35 + -4) = fVar42;
        fVar40 = 0.0;
        if (lVar32 < (long)(int)fVar41 + -1) {
          fVar40 = (pIVar36->Style).ItemInnerSpacing.x;
        }
        fVar42 = fVar42 + fVar40 + *(float *)((long)&pIVar38->ID + lVar35);
        lVar32 = lVar32 + 1;
        lVar35 = lVar35 + 0x2c;
      } while (lVar32 < (int)fVar41);
    }
    fVar40 = local_108[lVar21 * 3 + 2];
    fVar43 = local_108[lVar21 * 3 + 1] + fVar40;
    tab_bar->WidthAllTabs = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43) + tab_bar->WidthAllTabs;
    fVar40 = fVar42 + fVar40;
    iVar24 = iVar24 + (int)fVar41;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 3);
  if ((char)local_b0 != '\0') {
    tab_bar->SelectedTabId = 0;
  }
  IVar27 = local_c8._0_4_;
  if (((tab_bar->SelectedTabId == 0) && (tab_bar->NextSelectedTabId == 0)) &&
     (local_d0 != (ImVec2)0x0)) {
    IVar27 = *(ImGuiID *)local_d0;
    tab_bar->SelectedTabId = IVar27;
  }
  pIVar38 = (ImGuiTabItem *)(ulong)tab_bar->SelectedTabId;
  tab_bar->VisibleTabId = tab_bar->SelectedTabId;
  tab_bar->VisibleTabWasSubmitted = false;
  if (IVar27 != 0) {
    uVar30 = (ulong)(tab_bar->Tabs).Size;
    bVar19 = 0 < (long)uVar30;
    if (0 < (long)uVar30) {
      pIVar38 = (tab_bar->Tabs).Data;
      bVar19 = true;
      if (pIVar38->ID != IVar27) {
        pIVar31 = pIVar38 + (uVar30 - 1);
        pIVar22 = pIVar38;
        uVar25 = 0;
        do {
          uVar29 = uVar30;
          pIVar38 = pIVar31;
          if (uVar30 - 1 == uVar25) break;
          pIVar38 = pIVar22 + 1;
          uVar29 = uVar25 + 1;
          pIVar1 = pIVar22 + 1;
          pIVar22 = pIVar38;
          uVar25 = uVar29;
        } while (pIVar1->ID != IVar27);
        bVar19 = uVar29 < uVar30;
      }
    }
    if (((bVar19) && (pIVar38 != (ImGuiTabItem *)0x0)) && ((pIVar38->Flags & 0xc0) == 0)) {
      fVar40 = GImGui->FontSize;
      iVar24 = (int)((ulong)((long)pIVar38 - (long)(tab_bar->Tabs).Data) >> 2) * -0x45d1745d;
      fVar41 = pIVar38->Offset - local_108[1];
      fVar42 = fVar40;
      if (iVar24 < (int)local_108[0]) {
        fVar42 = -0.0;
      }
      fVar42 = fVar41 - fVar42;
      if ((tab_bar->Tabs).Size - local_f0 <= iVar24 + 1) {
        fVar40 = 1.0;
      }
      fVar40 = fVar41 + pIVar38->Width + fVar40;
      fVar41 = ((((tab_bar->BarRect).Max.x - (tab_bar->BarRect).Min.x) - local_108[1]) - local_ec) -
               local_f4;
      tab_bar->ScrollingTargetDistToVisibility = 0.0;
      if ((fVar42 < tab_bar->ScrollingTarget) || (fVar41 <= fVar40 - fVar42)) {
        fVar43 = tab_bar->ScrollingAnim - fVar40;
      }
      else {
        if (fVar40 - fVar41 <= tab_bar->ScrollingTarget) goto LAB_00228166;
        fVar43 = (fVar42 - fVar41) - tab_bar->ScrollingAnim;
        fVar42 = fVar40 - fVar41;
      }
      tab_bar->ScrollingTargetDistToVisibility = (float)(-(uint)(0.0 <= fVar43) & (uint)fVar43);
      tab_bar->ScrollingTarget = fVar42;
    }
  }
LAB_00228166:
  fVar40 = (tab_bar->BarRect).Min.x;
  fVar42 = (tab_bar->BarRect).Max.x;
  auVar45._0_4_ = tab_bar->WidthAllTabs - (fVar42 - fVar40);
  uVar4 = tab_bar->ScrollingAnim;
  uVar5 = tab_bar->ScrollingTarget;
  auVar44._4_4_ = uVar5;
  auVar44._0_4_ = uVar4;
  auVar44._8_8_ = 0;
  auVar45._4_4_ = auVar45._0_4_;
  auVar45._8_4_ = auVar45._0_4_;
  auVar45._12_4_ = auVar45._0_4_;
  auVar45 = minps(auVar44,auVar45);
  fVar41 = (float)(-(uint)(0.0 <= auVar45._0_4_) & (uint)auVar45._0_4_);
  fVar43 = (float)(-(uint)(0.0 <= auVar45._4_4_) & (uint)auVar45._4_4_);
  tab_bar->ScrollingAnim = fVar41;
  tab_bar->ScrollingTarget = fVar43;
  if ((fVar41 != fVar43) || (NAN(fVar41) || NAN(fVar43))) {
    fVar46 = pIVar36->FontSize * 70.0;
    uVar33 = -(uint)(fVar46 <= tab_bar->ScrollingSpeed);
    fVar47 = ABS(fVar43 - fVar41) / 0.3;
    fVar46 = (float)(~uVar33 & (uint)fVar46 | (uint)tab_bar->ScrollingSpeed & uVar33);
    uVar33 = -(uint)(fVar47 <= fVar46);
    fVar47 = (float)(~uVar33 & (uint)fVar47 | uVar33 & (uint)fVar46);
    tab_bar->ScrollingSpeed = fVar47;
    fVar46 = fVar43;
    if ((pIVar36->FrameCount <= tab_bar->PrevFrameVisible + 1) &&
       (tab_bar->ScrollingTargetDistToVisibility <= pIVar36->FontSize * 10.0)) {
      fVar47 = fVar47 * (pIVar36->IO).DeltaTime;
      if (fVar43 <= fVar41) {
        fVar46 = fVar41;
        if (fVar43 < fVar41) {
          fVar41 = fVar41 - fVar47;
          uVar33 = -(uint)(fVar43 <= fVar41);
          fVar46 = (float)((uint)fVar41 & uVar33 | ~uVar33 & (uint)fVar43);
        }
      }
      else {
        fVar46 = fVar41 + fVar47;
        if (fVar43 <= fVar46) {
          fVar46 = fVar43;
        }
      }
    }
    tab_bar->ScrollingAnim = fVar46;
  }
  else {
    tab_bar->ScrollingSpeed = 0.0;
  }
  tab_bar->ScrollingRectMinX = fVar40 + local_108[1] + local_108[2];
  tab_bar->ScrollingRectMaxX = (fVar42 - local_ec) - local_f4;
  if ((tab_bar->Flags & 0x100000) == 0) {
    iVar24 = (tab_bar->TabsNames).Buf.Capacity;
    if (iVar24 < 0) {
      uVar33 = iVar24 / 2 + iVar24;
      size = 0;
      if (0 < (int)uVar33) {
        size = (size_t)uVar33;
      }
      uStack_110 = 0x22828c;
      __dest_00 = (char *)MemAlloc(size);
      __src = (tab_bar->TabsNames).Buf.Data;
      if (__src != (char *)0x0) {
        uStack_110 = 0x2282aa;
        memcpy(__dest_00,__src,(long)(tab_bar->TabsNames).Buf.Size);
        uStack_110 = 0x2282b6;
        MemFree((tab_bar->TabsNames).Buf.Data);
      }
      (tab_bar->TabsNames).Buf.Data = __dest_00;
      (tab_bar->TabsNames).Buf.Capacity = (int)size;
    }
    (tab_bar->TabsNames).Buf.Size = 0;
  }
  pIVar37 = pIVar36->CurrentWindow;
  (pIVar37->DC).CursorPos = (tab_bar->BarRect).Min;
  local_58.y = (tab_bar->BarRect).Max.y - (tab_bar->BarRect).Min.y;
  local_58.x = tab_bar->WidthAllTabs;
  uStack_110 = 0x22830a;
  ItemSize((ImVec2 *)&local_58,(tab_bar->FramePadding).y);
  fVar42 = (tab_bar->BarRect).Min.x + tab_bar->WidthAllTabsIdeal;
  fVar40 = (pIVar37->DC).IdealMaxPos.x;
  uVar33 = -(uint)(fVar42 <= fVar40);
  (pIVar37->DC).IdealMaxPos.x = (float)(uVar33 & (uint)fVar40 | ~uVar33 & (uint)fVar42);
  return;
}

Assistant:

static void ImGui::TabBarLayout(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    tab_bar->WantLayout = false;

    // Garbage collect by compacting list
    // Detect if we need to sort out tab list (e.g. in rare case where a tab changed section)
    int tab_dst_n = 0;
    bool need_sort_by_section = false;
    ImGuiTabBarSection sections[3]; // Layout sections: Leading, Central, Trailing
    for (int tab_src_n = 0; tab_src_n < tab_bar->Tabs.Size; tab_src_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_src_n];
        if (tab->LastFrameVisible < tab_bar->PrevFrameVisible || tab->WantClose)
        {
            // Remove tab
            if (tab_bar->VisibleTabId == tab->ID) { tab_bar->VisibleTabId = 0; }
            if (tab_bar->SelectedTabId == tab->ID) { tab_bar->SelectedTabId = 0; }
            if (tab_bar->NextSelectedTabId == tab->ID) { tab_bar->NextSelectedTabId = 0; }
            continue;
        }
        if (tab_dst_n != tab_src_n)
            tab_bar->Tabs[tab_dst_n] = tab_bar->Tabs[tab_src_n];

        tab = &tab_bar->Tabs[tab_dst_n];
        tab->IndexDuringLayout = (ImS16)tab_dst_n;

        // We will need sorting if tabs have changed section (e.g. moved from one of Leading/Central/Trailing to another)
        int curr_tab_section_n = TabItemGetSectionIdx(tab);
        if (tab_dst_n > 0)
        {
            ImGuiTabItem* prev_tab = &tab_bar->Tabs[tab_dst_n - 1];
            int prev_tab_section_n = TabItemGetSectionIdx(prev_tab);
            if (curr_tab_section_n == 0 && prev_tab_section_n != 0)
                need_sort_by_section = true;
            if (prev_tab_section_n == 2 && curr_tab_section_n != 2)
                need_sort_by_section = true;
        }

        sections[curr_tab_section_n].TabCount++;
        tab_dst_n++;
    }
    if (tab_bar->Tabs.Size != tab_dst_n)
        tab_bar->Tabs.resize(tab_dst_n);

    if (need_sort_by_section)
        ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerBySection);

    // Calculate spacing between sections
    sections[0].Spacing = sections[0].TabCount > 0 && (sections[1].TabCount + sections[2].TabCount) > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;
    sections[1].Spacing = sections[1].TabCount > 0 && sections[2].TabCount > 0 ? g.Style.ItemInnerSpacing.x : 0.0f;

    // Setup next selected tab
    ImGuiID scroll_to_tab_id = 0;
    if (tab_bar->NextSelectedTabId)
    {
        tab_bar->SelectedTabId = tab_bar->NextSelectedTabId;
        tab_bar->NextSelectedTabId = 0;
        scroll_to_tab_id = tab_bar->SelectedTabId;
    }

    // Process order change request (we could probably process it when requested but it's just saner to do it in a single spot).
    if (tab_bar->ReorderRequestTabId != 0)
    {
        if (TabBarProcessReorder(tab_bar))
            if (tab_bar->ReorderRequestTabId == tab_bar->SelectedTabId)
                scroll_to_tab_id = tab_bar->ReorderRequestTabId;
        tab_bar->ReorderRequestTabId = 0;
    }

    // Tab List Popup (will alter tab_bar->BarRect and therefore the available width!)
    const bool tab_list_popup_button = (tab_bar->Flags & ImGuiTabBarFlags_TabListPopupButton) != 0;
    if (tab_list_popup_button)
        if (ImGuiTabItem* tab_to_select = TabBarTabListPopupButton(tab_bar)) // NB: Will alter BarRect.Min.x!
            scroll_to_tab_id = tab_bar->SelectedTabId = tab_to_select->ID;

    // Leading/Trailing tabs will be shrink only if central one aren't visible anymore, so layout the shrink data as: leading, trailing, central
    // (whereas our tabs are stored as: leading, central, trailing)
    int shrink_buffer_indexes[3] = { 0, sections[0].TabCount + sections[2].TabCount, sections[0].TabCount };
    g.ShrinkWidthBuffer.resize(tab_bar->Tabs.Size);

    // Compute ideal tabs widths + store them into shrink buffer
    ImGuiTabItem* most_recently_selected_tab = NULL;
    int curr_section_n = -1;
    bool found_selected_tab_id = false;
    for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
    {
        ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
        IM_ASSERT(tab->LastFrameVisible >= tab_bar->PrevFrameVisible);

        if ((most_recently_selected_tab == NULL || most_recently_selected_tab->LastFrameSelected < tab->LastFrameSelected) && !(tab->Flags & ImGuiTabItemFlags_Button))
            most_recently_selected_tab = tab;
        if (tab->ID == tab_bar->SelectedTabId)
            found_selected_tab_id = true;
        if (scroll_to_tab_id == 0 && g.NavJustMovedToId == tab->ID)
            scroll_to_tab_id = tab->ID;

        // Refresh tab width immediately, otherwise changes of style e.g. style.FramePadding.x would noticeably lag in the tab bar.
        // Additionally, when using TabBarAddTab() to manipulate tab bar order we occasionally insert new tabs that don't have a width yet,
        // and we cannot wait for the next BeginTabItem() call. We cannot compute this width within TabBarAddTab() because font size depends on the active window.
        const char* tab_name = tab_bar->GetTabName(tab);
        const bool has_close_button_or_unsaved_marker = (tab->Flags & ImGuiTabItemFlags_NoCloseButton) == 0 || (tab->Flags & ImGuiTabItemFlags_UnsavedDocument);
        tab->ContentWidth = (tab->RequestedWidth >= 0.0f) ? tab->RequestedWidth : TabItemCalcSize(tab_name, has_close_button_or_unsaved_marker).x;

        int section_n = TabItemGetSectionIdx(tab);
        ImGuiTabBarSection* section = &sections[section_n];
        section->Width += tab->ContentWidth + (section_n == curr_section_n ? g.Style.ItemInnerSpacing.x : 0.0f);
        curr_section_n = section_n;

        // Store data so we can build an array sorted by width if we need to shrink tabs down
        IM_MSVC_WARNING_SUPPRESS(6385);
        ImGuiShrinkWidthItem* shrink_width_item = &g.ShrinkWidthBuffer[shrink_buffer_indexes[section_n]++];
        shrink_width_item->Index = tab_n;
        shrink_width_item->Width = shrink_width_item->InitialWidth = tab->ContentWidth;
        tab->Width = ImMax(tab->ContentWidth, 1.0f);
    }

    // Compute total ideal width (used for e.g. auto-resizing a window)
    tab_bar->WidthAllTabsIdeal = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
        tab_bar->WidthAllTabsIdeal += sections[section_n].Width + sections[section_n].Spacing;

    // Horizontal scrolling buttons
    // (note that TabBarScrollButtons() will alter BarRect.Max.x)
    if ((tab_bar->WidthAllTabsIdeal > tab_bar->BarRect.GetWidth() && tab_bar->Tabs.Size > 1) && !(tab_bar->Flags & ImGuiTabBarFlags_NoTabListScrollingButtons) && (tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyScroll))
        if (ImGuiTabItem* scroll_and_select_tab = TabBarScrollingButtons(tab_bar))
        {
            scroll_to_tab_id = scroll_and_select_tab->ID;
            if ((scroll_and_select_tab->Flags & ImGuiTabItemFlags_Button) == 0)
                tab_bar->SelectedTabId = scroll_to_tab_id;
        }

    // Shrink widths if full tabs don't fit in their allocated space
    float section_0_w = sections[0].Width + sections[0].Spacing;
    float section_1_w = sections[1].Width + sections[1].Spacing;
    float section_2_w = sections[2].Width + sections[2].Spacing;
    bool central_section_is_visible = (section_0_w + section_2_w) < tab_bar->BarRect.GetWidth();
    float width_excess;
    if (central_section_is_visible)
        width_excess = ImMax(section_1_w - (tab_bar->BarRect.GetWidth() - section_0_w - section_2_w), 0.0f); // Excess used to shrink central section
    else
        width_excess = (section_0_w + section_2_w) - tab_bar->BarRect.GetWidth(); // Excess used to shrink leading/trailing section

    // With ImGuiTabBarFlags_FittingPolicyScroll policy, we will only shrink leading/trailing if the central section is not visible anymore
    if (width_excess >= 1.0f && ((tab_bar->Flags & ImGuiTabBarFlags_FittingPolicyResizeDown) || !central_section_is_visible))
    {
        int shrink_data_count = (central_section_is_visible ? sections[1].TabCount : sections[0].TabCount + sections[2].TabCount);
        int shrink_data_offset = (central_section_is_visible ? sections[0].TabCount + sections[2].TabCount : 0);
        ShrinkWidths(g.ShrinkWidthBuffer.Data + shrink_data_offset, shrink_data_count, width_excess);

        // Apply shrunk values into tabs and sections
        for (int tab_n = shrink_data_offset; tab_n < shrink_data_offset + shrink_data_count; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[g.ShrinkWidthBuffer[tab_n].Index];
            float shrinked_width = IM_FLOOR(g.ShrinkWidthBuffer[tab_n].Width);
            if (shrinked_width < 0.0f)
                continue;

            shrinked_width = ImMax(1.0f, shrinked_width);
            int section_n = TabItemGetSectionIdx(tab);
            sections[section_n].Width -= (tab->Width - shrinked_width);
            tab->Width = shrinked_width;
        }
    }

    // Layout all active tabs
    int section_tab_index = 0;
    float tab_offset = 0.0f;
    tab_bar->WidthAllTabs = 0.0f;
    for (int section_n = 0; section_n < 3; section_n++)
    {
        ImGuiTabBarSection* section = &sections[section_n];
        if (section_n == 2)
            tab_offset = ImMin(ImMax(0.0f, tab_bar->BarRect.GetWidth() - section->Width), tab_offset);

        for (int tab_n = 0; tab_n < section->TabCount; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[section_tab_index + tab_n];
            tab->Offset = tab_offset;
            tab_offset += tab->Width + (tab_n < section->TabCount - 1 ? g.Style.ItemInnerSpacing.x : 0.0f);
        }
        tab_bar->WidthAllTabs += ImMax(section->Width + section->Spacing, 0.0f);
        tab_offset += section->Spacing;
        section_tab_index += section->TabCount;
    }

    // If we have lost the selected tab, select the next most recently active one
    if (found_selected_tab_id == false)
        tab_bar->SelectedTabId = 0;
    if (tab_bar->SelectedTabId == 0 && tab_bar->NextSelectedTabId == 0 && most_recently_selected_tab != NULL)
        scroll_to_tab_id = tab_bar->SelectedTabId = most_recently_selected_tab->ID;

    // Lock in visible tab
    tab_bar->VisibleTabId = tab_bar->SelectedTabId;
    tab_bar->VisibleTabWasSubmitted = false;

    // Update scrolling
    if (scroll_to_tab_id != 0)
        TabBarScrollToTab(tab_bar, scroll_to_tab_id, sections);
    tab_bar->ScrollingAnim = TabBarScrollClamp(tab_bar, tab_bar->ScrollingAnim);
    tab_bar->ScrollingTarget = TabBarScrollClamp(tab_bar, tab_bar->ScrollingTarget);
    if (tab_bar->ScrollingAnim != tab_bar->ScrollingTarget)
    {
        // Scrolling speed adjust itself so we can always reach our target in 1/3 seconds.
        // Teleport if we are aiming far off the visible line
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, 70.0f * g.FontSize);
        tab_bar->ScrollingSpeed = ImMax(tab_bar->ScrollingSpeed, ImFabs(tab_bar->ScrollingTarget - tab_bar->ScrollingAnim) / 0.3f);
        const bool teleport = (tab_bar->PrevFrameVisible + 1 < g.FrameCount) || (tab_bar->ScrollingTargetDistToVisibility > 10.0f * g.FontSize);
        tab_bar->ScrollingAnim = teleport ? tab_bar->ScrollingTarget : ImLinearSweep(tab_bar->ScrollingAnim, tab_bar->ScrollingTarget, g.IO.DeltaTime * tab_bar->ScrollingSpeed);
    }
    else
    {
        tab_bar->ScrollingSpeed = 0.0f;
    }
    tab_bar->ScrollingRectMinX = tab_bar->BarRect.Min.x + sections[0].Width + sections[0].Spacing;
    tab_bar->ScrollingRectMaxX = tab_bar->BarRect.Max.x - sections[2].Width - sections[1].Spacing;

    // Clear name buffers
    if ((tab_bar->Flags & ImGuiTabBarFlags_DockNode) == 0)
        tab_bar->TabsNames.Buf.resize(0);

    // Actual layout in host window (we don't do it in BeginTabBar() so as not to waste an extra frame)
    ImGuiWindow* window = g.CurrentWindow;
    window->DC.CursorPos = tab_bar->BarRect.Min;
    ItemSize(ImVec2(tab_bar->WidthAllTabs, tab_bar->BarRect.GetHeight()), tab_bar->FramePadding.y);
    window->DC.IdealMaxPos.x = ImMax(window->DC.IdealMaxPos.x, tab_bar->BarRect.Min.x + tab_bar->WidthAllTabsIdeal);
}